

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int ReadInt32(unqlite_file *pFd,sxu32 *pOut,sxi64 iOfft)

{
  int iVar1;
  uchar zBuf [4];
  
  iVar1 = (*pFd->pMethods->xRead)(pFd,zBuf,4,iOfft);
  if (iVar1 == 0) {
    *pOut = (uint)zBuf >> 0x18 | ((uint)zBuf & 0xff0000) >> 8 | ((uint)zBuf & 0xff00) << 8 |
            (int)zBuf << 0x18;
  }
  return iVar1;
}

Assistant:

static int ReadInt32(unqlite_file *pFd,sxu32 *pOut,sxi64 iOfft)
{
	unsigned char zBuf[4];
	int rc;
	rc = unqliteOsRead(pFd,zBuf,sizeof(zBuf),iOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	SyBigEndianUnpack32(zBuf,pOut);
	return UNQLITE_OK;
}